

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

void chunk(LexState *ls)

{
  unsigned_short *puVar1;
  FuncState *pFVar2;
  Instruction *pIVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int nexps;
  int iVar8;
  uint uVar9;
  uint first;
  TString *pTVar10;
  TString *pTVar11;
  FuncState *pFVar12;
  expdesc v;
  expdesc local_50;
  FuncState *local_38;
  
  enterlevel(ls);
  bVar4 = false;
  while (!bVar4) {
    iVar5 = (ls->t).token;
    if ((iVar5 - 0x104U < 0x1c) && ((0x8010007U >> (iVar5 - 0x104U & 0x1f) & 1) != 0)) break;
    if (0x13 < iVar5 - 0x102U) {
switchD_0010f4df_caseD_104:
      pFVar2 = ls->fs;
      primaryexp(ls,(expdesc *)&v.u.s);
      if (v.u.s.info == 0xd) {
        pIVar3 = pFVar2->f->code;
        pIVar3[v.t] = pIVar3[v.t] & 0xff803fff | 0x4000;
      }
      else {
        v.k = VVOID;
        v._4_4_ = 0;
        assignment(ls,(LHS_assign *)&v,1);
      }
      goto LAB_0010fcf7;
    }
    iVar8 = ls->linenumber;
    switch(iVar5) {
    case 0x102:
      luaX_next(ls);
      breakstat(ls);
      bVar4 = true;
      break;
    case 0x103:
      luaX_next(ls);
      block(ls);
      check_match(ls,0x106,0x103,iVar8);
      goto LAB_0010fcf7;
    default:
      goto switchD_0010f4df_caseD_104;
    case 0x108:
      pFVar2 = ls->fs;
      local_50.u.s.info = -1;
      local_50.u.s.aux._0_1_ = pFVar2->nactvar;
      local_50.u.s.aux._1_2_ = 0x100;
      local_50._0_8_ = pFVar2->bl;
      pFVar2->bl = (BlockCnt *)&local_50;
      luaX_next(ls);
      pTVar11 = str_checkname(ls);
      iVar5 = (ls->t).token;
      if ((iVar5 == 0x2c) || (iVar5 == 0x10b)) {
        local_38 = ls->fs;
        iVar5 = local_38->freereg;
        pTVar10 = luaX_newstring(ls,"(for generator)",0xf);
        new_localvar(ls,pTVar10,0);
        pTVar10 = luaX_newstring(ls,"(for state)",0xb);
        new_localvar(ls,pTVar10,1);
        pTVar10 = luaX_newstring(ls,"(for control)",0xd);
        new_localvar(ls,pTVar10,2);
        new_localvar(ls,pTVar11,3);
        iVar6 = 4;
        while (iVar7 = testnext(ls,0x2c), iVar7 != 0) {
          pTVar11 = str_checkname(ls);
          new_localvar(ls,pTVar11,iVar6);
          iVar6 = iVar6 + 1;
        }
        checknext(ls,0x10b);
        iVar7 = ls->linenumber;
        nexps = explist1(ls,&v);
        adjust_assign(ls,3,nexps,&v);
        luaK_checkstack(local_38,3);
        forbody(ls,iVar5,iVar7,iVar6 + -3,0);
      }
      else if (iVar5 == 0x3d) {
        local_38 = ls->fs;
        iVar5 = local_38->freereg;
        pTVar10 = luaX_newstring(ls,"(for index)",0xb);
        new_localvar(ls,pTVar10,0);
        pTVar10 = luaX_newstring(ls,"(for limit)",0xb);
        new_localvar(ls,pTVar10,1);
        pTVar10 = luaX_newstring(ls,"(for step)",10);
        new_localvar(ls,pTVar10,2);
        new_localvar(ls,pTVar11,3);
        checknext(ls,0x3d);
        exp1(ls);
        checknext(ls,0x2c);
        exp1(ls);
        iVar6 = testnext(ls,0x2c);
        pFVar12 = local_38;
        if (iVar6 == 0) {
          iVar6 = local_38->freereg;
          uVar9 = luaK_numberK(local_38,1.0);
          luaK_codeABx(pFVar12,OP_LOADK,iVar6,uVar9);
          luaK_reserveregs(pFVar12,1);
        }
        else {
          exp1(ls);
        }
        forbody(ls,iVar5,iVar8,1,1);
      }
      else {
        luaX_syntaxerror(ls,"\'=\' or \'in\' expected");
      }
      check_match(ls,0x106,0x108,iVar8);
      leaveblock(pFVar2);
      goto LAB_0010fcf7;
    case 0x109:
      luaX_next(ls);
      singlevar(ls,&v);
      while (iVar5 = (ls->t).token, iVar5 == 0x2e) {
        field(ls,&v);
      }
      if (iVar5 == 0x3a) {
        field(ls,&v);
      }
      body(ls,&local_50,(uint)(iVar5 == 0x3a),iVar8);
      luaK_storevar(ls->fs,&v,&local_50);
      luaK_fixline(ls->fs,iVar8);
      goto LAB_0010fcf7;
    case 0x10a:
      pFVar2 = ls->fs;
      v.k = ~VVOID;
      while( true ) {
        luaX_next(ls);
        iVar6 = cond(ls);
        checknext(ls,0x112);
        block(ls);
        iVar5 = (ls->t).token;
        if (iVar5 != 0x105) break;
        iVar5 = luaK_jump(pFVar2);
        luaK_concat(pFVar2,(int *)&v,iVar5);
        luaK_patchtohere(pFVar2,iVar6);
      }
      if (iVar5 == 0x104) {
        iVar5 = luaK_jump(pFVar2);
        luaK_concat(pFVar2,(int *)&v,iVar5);
        luaK_patchtohere(pFVar2,iVar6);
        luaX_next(ls);
        block(ls);
      }
      else {
        luaK_concat(pFVar2,(int *)&v,iVar6);
      }
      luaK_patchtohere(pFVar2,v.k);
      check_match(ls,0x106,0x10a,iVar8);
      bVar4 = false;
      break;
    case 0x10c:
      luaX_next(ls);
      iVar5 = testnext(ls,0x109);
      if (iVar5 == 0) {
        iVar5 = 0;
        do {
          pTVar11 = str_checkname(ls);
          iVar6 = iVar5 + 1;
          new_localvar(ls,pTVar11,iVar5);
          iVar8 = testnext(ls,0x2c);
          iVar5 = iVar6;
        } while (iVar8 != 0);
        iVar5 = testnext(ls,0x3d);
        if (iVar5 == 0) {
          v._0_8_ = v._0_8_ & 0xffffffff00000000;
          iVar5 = 0;
        }
        else {
          iVar5 = explist1(ls,&v);
        }
        adjust_assign(ls,iVar6,iVar5,&v);
        adjustlocalvars(ls,iVar6);
        goto LAB_0010fcf7;
      }
      pFVar2 = ls->fs;
      pTVar11 = str_checkname(ls);
      bVar4 = false;
      new_localvar(ls,pTVar11,0);
      v.u.s.info = pFVar2->freereg;
      v.t = -1;
      v.f = -1;
      v.k = VLOCAL;
      luaK_reserveregs(pFVar2,1);
      adjustlocalvars(ls,1);
      body(ls,&local_50,0,ls->linenumber);
      luaK_storevar(pFVar2,&v,&local_50);
      pFVar2->f->locvars[*(ushort *)&pFVar2->upvalues[(ulong)pFVar2->nactvar + 0x3b].info].startpc =
           pFVar2->pc;
      break;
    case 0x110:
      pFVar2 = ls->fs;
      iVar5 = luaK_getlabel(pFVar2);
      v.u.s.info = -1;
      v.u.s.aux._2_1_ = 1;
      v.u.s.aux._0_1_ = pFVar2->nactvar;
      v.u.s.aux._1_1_ = 0;
      v._0_8_ = pFVar2->bl;
      local_50.u.s.info = -1;
      local_50.u.s.aux._1_2_ = 0;
      pFVar2->bl = (BlockCnt *)&local_50;
      local_50._0_8_ = (LHS_assign *)&v;
      local_50.u.s.aux._0_1_ = v.u.s.aux._0_1_;
      luaX_next(ls);
      chunk(ls);
      check_match(ls,0x114,0x110,iVar8);
      iVar8 = cond(ls);
      if (local_50.u.s.aux._1_1_ == '\0') {
        leaveblock(pFVar2);
        pFVar12 = ls->fs;
      }
      else {
        breakstat(ls);
        luaK_patchtohere(ls->fs,iVar8);
        leaveblock(pFVar2);
        pFVar12 = ls->fs;
        iVar8 = luaK_jump(pFVar2);
      }
      luaK_patchlist(pFVar12,iVar8,iVar5);
      leaveblock(pFVar2);
      bVar4 = false;
      break;
    case 0x111:
      pFVar2 = ls->fs;
      luaX_next(ls);
      iVar5 = (ls->t).token;
      first = 0;
      uVar9 = iVar5 - 0x104;
      if ((uVar9 < 0x1c) && ((0x8010007U >> (uVar9 & 0x1f) & 1) != 0)) {
        first = 0;
        iVar8 = 0;
      }
      else {
        iVar8 = 0;
        if (iVar5 != 0x3b) {
          iVar8 = explist1(ls,&v);
          if (v.k - VCALL < 2) {
            luaK_setreturns(pFVar2,&v,-1);
            if ((iVar8 == 1) && (v.k == VCALL)) {
              pIVar3 = pFVar2->f->code;
              pIVar3[v.u.s.info] = pIVar3[v.u.s.info] & 0xffffffc0 | 0x1d;
            }
            first = (uint)pFVar2->nactvar;
            iVar8 = -1;
          }
          else if (iVar8 == 1) {
            first = luaK_exp2anyreg(pFVar2,&v);
            iVar8 = 1;
          }
          else {
            luaK_exp2nextreg(pFVar2,&v);
            first = (uint)pFVar2->nactvar;
          }
        }
      }
      luaK_ret(pFVar2,first,iVar8);
      bVar4 = true;
      break;
    case 0x115:
      pFVar2 = ls->fs;
      luaX_next(ls);
      iVar5 = luaK_getlabel(pFVar2);
      iVar6 = cond(ls);
      v.u.s.info = -1;
      v.u.s.aux._2_1_ = 1;
      v.u.s.aux._0_1_ = pFVar2->nactvar;
      v.u.s.aux._1_1_ = 0;
      v._0_8_ = pFVar2->bl;
      pFVar2->bl = (BlockCnt *)&v;
      checknext(ls,0x103);
      block(ls);
      iVar7 = luaK_jump(pFVar2);
      luaK_patchlist(pFVar2,iVar7,iVar5);
      check_match(ls,0x106,0x115,iVar8);
      leaveblock(pFVar2);
      luaK_patchtohere(pFVar2,iVar6);
LAB_0010fcf7:
      bVar4 = false;
    }
    testnext(ls,0x3b);
    ls->fs->freereg = (uint)ls->fs->nactvar;
  }
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return;
}

Assistant:

static void chunk (LexState *ls) {
  /* chunk -> { stat [`;'] } */
  int islast = 0;
  enterlevel(ls);
  while (!islast && !block_follow(ls->t.token)) {
    islast = statement(ls);
    testnext(ls, ';');
    lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
               ls->fs->freereg >= ls->fs->nactvar);
    ls->fs->freereg = ls->fs->nactvar;  /* free registers */
  }
  leavelevel(ls);
}